

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O0

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> * __thiscall
chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>
          (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,dispatch *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Type_Conversions_State *t_conversions)

{
  Type_Info t_from;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  bad_boxed_cast *this_00;
  Type_Conversions_State *in_R8;
  _func_Boxed_Value_Boxed_Value_ptr *p;
  undefined8 local_50;
  undefined8 local_48;
  bool has_arity_match;
  Type_Conversions_State *t_conversions_local;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *funcs_local;
  
  cVar2 = std::
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          ::begin((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                   *)this);
  cVar3 = std::
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          ::end((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                 *)this);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>,chaiscript::dispatch::functor<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>const&,chaiscript::Type_Conversions_State_const*)::_lambda(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>
                    (cVar2._M_current,cVar3._M_current);
  if (!bVar1) {
    this_00 = (bad_boxed_cast *)__cxa_allocate_exception(0x38);
    user_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>();
    t_from.m_bare_type_info = (type_info *)local_50;
    t_from.m_type_info = (type_info *)p;
    t_from._16_8_ = local_48;
    exception::bad_boxed_cast::bad_boxed_cast
              (this_00,t_from,
               (type_info *)
               &std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>::typeinfo);
    __cxa_throw(this_00,&exception::bad_boxed_cast::typeinfo,
                exception::bad_boxed_cast::~bad_boxed_cast);
  }
  detail::build_function_caller_helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
            (__return_storage_ptr__,(detail *)0x0,(_func_Boxed_Value_Boxed_Value_ptr *)this,funcs,
             in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::function<FunctionType> functor(const std::vector<Const_Proxy_Function> &funcs, const Type_Conversions_State *t_conversions) {
      const bool has_arity_match = std::any_of(funcs.begin(), funcs.end(), [](const Const_Proxy_Function &f) {
        return f->get_arity() == -1 || size_t(f->get_arity()) == detail::arity(static_cast<FunctionType *>(nullptr));
      });

      if (!has_arity_match) {
        throw exception::bad_boxed_cast(user_type<Const_Proxy_Function>(), typeid(std::function<FunctionType>));
      }

      FunctionType *p = nullptr;
      return detail::build_function_caller_helper(p, funcs, t_conversions);
    }